

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

int __thiscall AliHttpRequest::WaitResponseHeaderComplete(AliHttpRequest *this)

{
  int iVar1;
  char local_1018 [4];
  int last_Read;
  char Read_buf [4096];
  AliHttpRequest *this_local;
  
  Read_buf._4088_8_ = this;
  memset(local_1018,0,0x1000);
  http_parser_init_(this->parser_,HTTP_RESPONSE);
  this->parser_->data = this;
  do {
    memset(local_1018,0,0x1000);
    iVar1 = (*this->connection_->_vptr_AliConnection[2])(this->connection_,local_1018,0x1000);
    if (iVar1 < 0) break;
    http_parser_execute_(this->parser_,&htp_hooks,local_1018,(long)iVar1);
    if ((this->parser_->field_0x17 & 0x7f) != 0) {
      return -1;
    }
  } while (((this->is_response_header_complete ^ 0xffU) & 1) != 0);
  if (iVar1 < 0) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = this->response_status_code_;
  }
  return this_local._4_4_;
}

Assistant:

int AliHttpRequest::WaitResponseHeaderComplete() {
  char Read_buf[4096] = {};
  int last_Read = 0;
  http_parser_init_(parser_, HTTP_RESPONSE);
  parser_->data = this;

  do{
    memset(Read_buf, 0, sizeof(Read_buf));
    last_Read = this->connection_->Read(Read_buf, sizeof(Read_buf));
    if(last_Read < 0) {
      break;
    }
    http_parser_execute_(parser_, &htp_hooks, Read_buf, last_Read);

    if(parser_->http_errno != 0) {
      return -1;
    }
  } while(!is_response_header_complete);
  
  if(last_Read < 0) {
    return -1;
  }

  return this->response_status_code_;
}